

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sVerify(g12s_params *params,octet *hash,octet *sig,octet *pubkey)

{
  err_t eVar1;
  bool_t bVar2;
  int iVar3;
  void *src;
  word *b;
  word *a;
  word *a_00;
  word *in_RCX;
  void *in_RDX;
  ec_o **unaff_RBX;
  void *in_RSI;
  g12s_deep_i in_RDI;
  void *stack;
  word *e;
  word *s;
  word *r;
  word *Q;
  ec_o *ec;
  size_t mo;
  size_t m;
  err_t code;
  void *in_stack_ffffffffffffff68;
  word *in_stack_ffffffffffffff70;
  word *b_00;
  word *in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  word *a_01;
  word *a_02;
  word *stack_00;
  ec_o *ec_00;
  void *n;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  ec_00 = (ec_o *)0x0;
  eVar1 = g12sEcCreate(unaff_RBX,
                       (g12s_params *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                       in_RDI);
  if (eVar1 == 0) {
    src = (void *)(ulong)(*(int *)in_RDI + 0x3fU >> 6);
    b = (word *)(ulong)(*(int *)in_RDI + 7U >> 3);
    bVar2 = memIsValid(in_RSI,(size_t)b);
    if (((bVar2 == 0) || (bVar2 = memIsValid(in_RDX,(long)b << 1), bVar2 == 0)) ||
       (bVar2 = memIsValid(in_RCX,ec_00->f->no << 1), bVar2 == 0)) {
      g12sEcClose((ec_o *)0x1784b1);
      eVar1 = 0x6d;
    }
    else {
      b_00 = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      a = b_00 + ec_00->f->n * 2;
      a_00 = a + (long)src;
      a_02 = a_00 + (long)src;
      a_01 = a_02 + (long)src;
      bVar2 = (*ec_00->f->from)(b_00,(octet *)in_RCX,ec_00->f,a_01);
      if ((bVar2 == 0) ||
         (bVar2 = (*ec_00->f->from)(b_00 + ec_00->f->n,(octet *)((long)in_RCX + ec_00->f->no),
                                    ec_00->f,a_01), bVar2 == 0)) {
        g12sEcClose((ec_o *)0x1785b9);
        eVar1 = 0x1f9;
      }
      else {
        memCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x1785e2);
        memRev(a_00,(size_t)b);
        u64From(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x178605);
        memCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x178619);
        memRev(a,(size_t)b);
        u64From(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x17863c);
        bVar2 = wwIsZero(a_00,(size_t)src);
        if (((bVar2 == 0) &&
            ((bVar2 = wwIsZero(a,(size_t)src), bVar2 == 0 &&
             (iVar3 = wwCmp(a_00,ec_00->order,(size_t)src), iVar3 < 0)))) &&
           (iVar3 = wwCmp(a,ec_00->order,(size_t)src), iVar3 < 0)) {
          memCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x1786cc);
          memRev(a_02,(size_t)b);
          u64From(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x1786ef);
          zzMod(in_RCX,(word *)CONCAT44(eVar1,in_stack_ffffffffffffffc8),(size_t)src,b,(size_t)ec_00
                ,b_00);
          bVar2 = wwIsZero(a_02,(size_t)src);
          if (bVar2 != 0) {
            *a_02 = 1;
          }
          zzInvMod(a_02,a_01,in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
          zzMulMod(a_02,a_01,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (size_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          zzMulMod(a_02,a_01,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (size_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          zzNegMod(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (size_t)in_stack_ffffffffffffff68);
          stack_00 = b_00;
          n = src;
          bVar2 = ecAddMulA(b_00,ec_00,a_01,2,ec_00->base,a_00,src,b_00,a_02,src);
          if (bVar2 == 0) {
            g12sEcClose((ec_o *)0x178822);
            eVar1 = 0x1f6;
          }
          else {
            (*ec_00->f->to)((octet *)stack_00,stack_00,ec_00->f,a_01);
            u64From(b_00,src,0x178875);
            zzMod(in_RCX,(word *)CONCAT44(eVar1,in_stack_ffffffffffffffc8),(size_t)n,b,(size_t)ec_00
                  ,stack_00);
            bVar2 = wwEq(a,a_00,(size_t)n);
            eVar1 = 0x1fe;
            if (bVar2 != 0) {
              eVar1 = 0;
            }
            g12sEcClose((ec_o *)0x1788d5);
          }
        }
        else {
          g12sEcClose((ec_o *)0x1786a8);
          eVar1 = 0x1fe;
        }
      }
    }
  }
  return eVar1;
}

Assistant:

err_t g12sVerify(const g12s_params* params, const octet hash[], 
	const octet sig[], const octet pubkey[])
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* Q;		/* [2n] открытый ключ / точка R */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	word* e;		/* [m] обработанное хэш-значение, v */
	void* stack;
	// старт
	code = g12sEcCreate(&ec, params, g12sVerify_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(sig, 2 * mo) ||
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	r = Q + 2 * ec->f->n;
	s = r + m;
	e = s + m;
	stack = e + m;
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, ec->f->n), pubkey + ec->f->no, ec->f, stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_PUBKEY;
	}
	// загрузить r и s
	memCopy(s, sig + mo, mo);
	memRev(s, mo);
	wwFrom(s, s, mo);
	memCopy(r, sig, mo);
	memRev(r, mo);
	wwFrom(r, r, mo);
	if (wwIsZero(s, m) || 
		wwIsZero(r, m) || 
		wwCmp(s, ec->order, m) >= 0 ||
		wwCmp(r, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_SIG;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// e <- e^{-1} \mod q [v]
	zzInvMod(e, e, ec->order, m, stack);
	// s <- s e \mod q [z1]
	zzMulMod(s, s, e, ec->order, m, stack);
	// e <- - e r \mod q [z2]
	zzMulMod(e, e, r, ec->order, m, stack);
	zzNegMod(e, e, ec->order, m);
	// Q <- s P + e Q [z1 P + z2 Q = R]
	if (!ecAddMulA(Q, ec, stack, 2, ec->base, s, m, Q, e, m))
	{
		g12sEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// s <- x_Q \mod q [x_R \mod q]
	qrTo((octet*)Q, ecX(Q), ec->f, stack);
	wwFrom(Q, Q, ec->f->no);
	zzMod(s, Q, ec->f->n, ec->order, m, stack);
	// s == r?
	code = wwEq(r, s, m) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	g12sEcClose(ec);
	return code;
}